

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamsAndBinds)

{
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_> pSVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view name;
  string_view name_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  DefinitionLookupResult result_00;
  DefinitionLookupResult result_01;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  string_view *psVar3;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *ppVar4;
  Entry *pEVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  reference pbVar9;
  pointer ppVar10;
  pointer ppVar11;
  group_type *pgVar12;
  pointer ppVar13;
  reference ppCVar14;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  *ppSVar15;
  reference ppSVar16;
  group_type *pgVar17;
  size_t sVar18;
  EVP_PKEY_CTX *pEVar19;
  SyntaxNode *pSVar20;
  size_t sVar21;
  group_type *pgVar22;
  pointer ppVar23;
  HierarchyOverrideNode *pHVar24;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *paVar25;
  equal_to<const_slang::syntax::SyntaxNode_*> *this_00;
  raw_key_type *__y;
  pointer pRVar26;
  EVP_PKEY_CTX *src;
  byte in_SIL;
  EVP_PKEY_CTX *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar27;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> sVar28;
  DefinitionSymbol *def_5;
  iterator __end2_2;
  iterator __begin2_2;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *__range2_2;
  InstanceSymbol *instance;
  iterator sit;
  HierarchyOverrideNode *hierarchyOverrideNode;
  DefinitionSymbol *def_4;
  type *__1;
  type *result_1;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  *__range2_1;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  iterator it;
  ParameterDecl *param;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *__range4_2;
  DefinitionSymbol *def_3;
  type *_;
  type *result;
  iterator __end3_4;
  iterator __begin3_4;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  *__range3_4;
  DefinitionSymbol *def_2;
  Symbol *defSym_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range4_1;
  type *defList_1;
  type *key_1;
  iterator __end3_3;
  iterator __begin3_3;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *__range3_3;
  TopCell *cell;
  iterator __end6_1;
  iterator __begin6_1;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> *__range6_1;
  SourceLibrary *lib_1;
  ConfigBlockSymbol *conf;
  iterator __end5;
  iterator __begin5;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  *__range5;
  ConfigBlockSymbol *foundConf;
  iterator confIt;
  DefinitionSymbol *def_1;
  Symbol *defSym_1;
  iterator __end6;
  iterator __begin6;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range6;
  DefinitionSymbol *foundDef;
  iterator defIt;
  string_view configSuffix;
  bool onlyConfig;
  size_type idx;
  SourceLibrary *targetLib;
  basic_string_view<char,_std::char_traits<char>_> searchName;
  basic_string_view<char,_std::char_traits<char>_> userProvidedName;
  iterator __end3_2;
  iterator __begin3_2;
  flat_hash_set<std::string_view> *__range3_2;
  anon_class_24_3_d9e6786c tryAddTop;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
  topNameMap;
  DefinitionSymbol *def;
  Symbol *defSym;
  iterator __end4;
  iterator __begin4;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range4;
  type *defList;
  type *key;
  iterator __end3_1;
  iterator __begin3_1;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *__range3_1;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  topDefs;
  anon_class_8_1_67989ee5 isValidTop;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:330:29)>
  guard;
  ParserMetadata *meta;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *__range3;
  flat_hash_map<std::string_view,_const_ConstantValue_*> cliOverrides;
  SourceLibrary *lib;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *libName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t hash_3;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_4;
  uint n_4;
  value_type *p_4;
  value_type *elements_4;
  int mask_4;
  group_type *pg_4;
  size_t pos_4;
  prober pb_4;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  locator loc;
  size_t pos0;
  size_t hash_5;
  Entry *k;
  uint n_5;
  value_type *p_5;
  value_type *elements_5;
  int mask_5;
  group_type *pg_5;
  size_t pos_5;
  prober pb_5;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
  x;
  locator loc_1;
  size_t pos0_1;
  size_t hash_6;
  SyntaxNode **k_1;
  uint n_6;
  value_type *p_6;
  value_type *elements_6;
  int mask_6;
  group_type *pg_6;
  size_t pos_6;
  prober pb_6;
  size_t hash_7;
  uint n_7;
  value_type *p_7;
  value_type *elements_7;
  int mask_7;
  group_type *pg_7;
  size_t pos_7;
  prober pb_7;
  Compilation *in_stack_ffffffffffffeaa8;
  ConfigBlockSymbol *in_stack_ffffffffffffeab0;
  ConfigRule *in_stack_ffffffffffffeab8;
  pair<slang::ConstantValue,_std::nullptr_t> *in_stack_ffffffffffffeac0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffeac8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffead0;
  undefined7 in_stack_ffffffffffffead8;
  char in_stack_ffffffffffffeadf;
  Compilation *in_stack_ffffffffffffeae0;
  Diagnostic *in_stack_ffffffffffffeaf0;
  undefined7 in_stack_ffffffffffffeaf8;
  undefined1 in_stack_ffffffffffffeaff;
  ConfigBlockSymbol *in_stack_ffffffffffffeb00;
  char *in_stack_ffffffffffffeb08;
  DefinitionSymbol *pDVar29;
  DefinitionSymbol *definition;
  Entry *in_stack_ffffffffffffeb18;
  Compilation *comp;
  DefinitionSymbol *in_stack_ffffffffffffeb20;
  SourceLocation locationOverride;
  undefined7 in_stack_ffffffffffffeb28;
  undefined1 in_stack_ffffffffffffeb2f;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
  *in_stack_ffffffffffffeb30;
  size_t in_stack_ffffffffffffeb38;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
  *in_stack_ffffffffffffeb40;
  undefined7 in_stack_ffffffffffffeb50;
  undefined1 in_stack_ffffffffffffeb57;
  SourceLocation in_stack_ffffffffffffeb58;
  Entry *in_stack_ffffffffffffeb60;
  DiagCode code;
  anon_class_24_3_d9e6786c *in_stack_ffffffffffffebd8;
  SyntaxNode **__x_00;
  undefined8 in_stack_ffffffffffffebe0;
  undefined4 in_stack_ffffffffffffebe8;
  undefined4 in_stack_ffffffffffffebec;
  undefined8 in_stack_ffffffffffffed60;
  undefined8 in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed70;
  undefined4 in_stack_ffffffffffffed74;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  local_1250;
  bool local_1031;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
  local_1018;
  pointer local_fe8;
  size_t sStack_fe0;
  pointer local_fc8;
  size_t sStack_fc0;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  local_fa8;
  EVP_PKEY_CTX *local_fa0;
  undefined8 local_f98;
  undefined4 local_f90;
  underlying_type local_f8c;
  ConfigBlockSymbol *local_f88;
  SourceLocation local_f80;
  ConfigBlockSymbol *local_f78;
  iterator local_f70;
  Entry local_f60;
  char_pointer local_f58;
  table_element_pointer local_f50;
  DefinitionSymbol *local_f48;
  DefinitionSymbol *local_f40;
  type *local_f38;
  type *local_f30;
  Symbol *local_f28;
  ConfigBlockSymbol *pCStack_f20;
  ConfigRule *local_f18;
  SourceLocation SStack_f10;
  SourceLocation local_f08;
  iterator local_f00;
  iterator local_ef8;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  *local_ef0;
  SmallVectorBase<const_slang::ast::InstanceSymbol_*> local_ee8 [2];
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_ea8;
  undefined8 local_e90;
  undefined1 local_e58 [24];
  char_pointer local_e40;
  table_element_pointer local_e38;
  const_iterator local_e30;
  const_iterator local_e28;
  const_iterator local_e20;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *local_e18;
  DefinitionSymbol *local_e10;
  type *local_e08;
  pointer local_e00;
  Symbol *local_df8;
  ConfigBlockSymbol *pCStack_df0;
  ConfigRule *local_de8;
  SourceLocation SStack_de0;
  SourceLocation local_dd8;
  iterator local_dd0;
  iterator local_dc8;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  *local_dc0;
  DefinitionSymbol **local_db8;
  DefinitionSymbol *local_da8;
  allocator_type local_da0;
  BumpAllocator *local_d90;
  table_element_pointer local_d88;
  DefinitionSymbol *local_d80;
  Type *local_d78;
  Type *local_d70;
  __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_d68;
  Type *local_d60;
  Type *local_d58;
  Type *local_d50;
  Type *local_d48;
  iterator local_d40;
  iterator local_d30;
  Type *local_d20;
  Type *local_d18;
  Type *pTStack_d10;
  Type *local_d08;
  undefined4 local_cfc;
  SourceLocation local_cf8;
  SourceLocation SStack_cf0;
  DefinitionLookupResult local_ce0;
  reference local_cc8;
  TopCell *local_cc0;
  __normal_iterator<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
  local_cb8;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> local_cb0;
  span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> *local_ca0;
  SourceLibrary *local_c98;
  ConfigBlockSymbol *local_c90;
  ConfigBlockSymbol **local_c88;
  __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
  local_c80;
  vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
  *local_c78;
  ConfigBlockSymbol *local_c70;
  iterator local_c68;
  char_pointer local_c58;
  table_element_pointer local_c50;
  Type *local_c48;
  Type *pTStack_c40;
  size_t local_c30;
  undefined4 local_c24;
  DefinitionLookupResult local_c10;
  DefinitionSymbol *local_bf8;
  Symbol *local_bf0;
  Symbol **local_be8;
  __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_be0;
  value_type_pointer local_bd8;
  DefinitionSymbol *local_bd0;
  iterator local_bc8;
  pointer local_bb8;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> local_b98;
  pointer local_b80;
  table_element_pointer local_b78;
  basic_string_view<char,_std::char_traits<char>_> local_b70;
  pointer local_b60;
  char *local_b58;
  basic_string_view<char,_std::char_traits<char>_> local_b50;
  byte local_b39;
  basic_string_view<char,_std::char_traits<char>_> local_b38;
  Type *local_b28;
  Type *pTStack_b20;
  size_t local_b18;
  undefined4 local_b0c;
  basic_string_view<char,_std::char_traits<char>_> local_b08;
  size_type local_af8;
  SourceLibrary *local_af0;
  basic_string_view<char,_std::char_traits<char>_> local_ae8;
  Type *local_ad8;
  Type *pTStack_ad0;
  size_ctrl_type local_ac8;
  iterator local_ab8;
  EVP_PKEY_CTX *local_aa8;
  pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *local_aa0;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  *local_a98;
  pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>
  local_a88 [4];
  DefinitionSymbol *local_9e0;
  SourceRange local_9d8;
  DefinitionLookupResult local_9c8;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> local_9b0;
  iterator local_988;
  Segment *local_978;
  table_element_pointer local_970;
  DefinitionSymbol *local_968;
  Symbol *local_960;
  pointer local_958;
  __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_950;
  type *local_948;
  type *local_940;
  pointer local_938;
  reference local_930;
  iterator local_928;
  iterator local_918;
  EVP_PKEY_CTX *local_908;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
  local_900;
  undefined8 local_898;
  anon_class_8_1_8991fb9c_for_func local_890;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:330:29)>
  local_888 [2];
  undefined8 local_868;
  __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
  local_860 [4];
  undefined1 local_840 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f0;
  undefined1 local_7e8 [248];
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *local_6f0;
  undefined1 local_6e8 [96];
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_688 [5];
  undefined8 local_610;
  pow2_quadratic_prober local_608;
  undefined8 local_5f8;
  size_t local_5f0;
  string_view *local_5e8;
  EVP_PKEY_CTX *local_5e0;
  pointer local_5d8;
  string_view *local_5d0;
  EVP_PKEY_CTX *local_5c8;
  uint local_5bc;
  value_type *local_5b8;
  value_type *local_5b0;
  uint local_5a4;
  group_type *local_5a0;
  size_t local_598;
  pow2_quadratic_prober local_590;
  pointer local_580;
  size_t local_578;
  string_view *local_570;
  EVP_PKEY_CTX *local_568;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  local_560;
  string_view *local_548;
  undefined1 *local_540;
  iterator local_538;
  value_type_pointer local_528;
  string_view *local_520;
  undefined1 *local_518;
  uint local_50c;
  value_type *local_508;
  value_type *local_500;
  uint local_4f4;
  group_type *local_4f0;
  size_t local_4e8;
  pow2_quadratic_prober local_4e0;
  value_type_pointer local_4d0;
  value_type_pointer local_4c8;
  string_view *local_4c0;
  undefined1 *local_4b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  local_4b0;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *local_498;
  pointer local_490;
  iterator local_488;
  pointer local_478;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *local_470;
  pointer local_468;
  uint local_45c;
  value_type *local_458;
  value_type *local_450;
  uint local_444;
  group_type *local_440;
  size_t local_438;
  pow2_quadratic_prober local_430;
  pointer local_420;
  size_t local_418;
  pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*> *local_410;
  pointer local_408;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
  local_400;
  basic_string_view<char,_std::char_traits<char>_> *local_3e8;
  EVP_PKEY_CTX *local_3e0;
  iterator local_3d8;
  group_type_pointer local_3c8;
  basic_string_view<char,_std::char_traits<char>_> *local_3c0;
  EVP_PKEY_CTX *local_3b8;
  uint local_3ac;
  value_type *local_3a8;
  value_type *local_3a0;
  uint local_394;
  value_type_pointer local_390;
  size_t local_388;
  pow2_quadratic_prober local_380;
  group_type_pointer local_370;
  group_type_pointer local_368;
  basic_string_view<char,_std::char_traits<char>_> *local_360;
  EVP_PKEY_CTX *local_358;
  undefined1 local_349;
  value_type_pointer local_348;
  EVP_PKEY_CTX *local_340;
  bool local_331 [25];
  iterator local_318;
  bool local_301 [25];
  iterator local_2e8;
  bool local_2d1;
  iterator local_2d0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
  local_2c0;
  size_t local_2a8;
  SourceLibrary *local_2a0;
  group_type_pointer local_298;
  value_type_pointer local_290;
  undefined1 *local_288;
  EVP_PKEY_CTX *local_280;
  uint local_274;
  value_type *local_270;
  value_type *local_268;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  Compilation *in_stack_fffffffffffffda8;
  pow2_quadratic_prober local_248;
  SourceLibrary *local_238;
  size_t local_230;
  group_type_pointer local_228;
  EVP_PKEY_CTX *local_220;
  undefined1 local_201 [17];
  Compilation *local_1f0;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *local_1e8;
  HierarchyOverrideNode *local_1e0;
  bool local_1d1 [25];
  iterator local_1b8;
  bool local_1a1 [25];
  iterator local_188;
  bool local_171;
  iterator local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
  local_160;
  size_t local_148;
  size_t local_140;
  SyntaxNode **local_138;
  Compilation *local_130;
  key_type *local_128;
  undefined1 *local_120;
  HierarchyOverrideNode *local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  size_t local_d0;
  size_t local_c8;
  SyntaxNode **local_c0;
  HierarchyOverrideNode *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
  local_b0;
  Entry *local_98;
  EVP_PKEY_CTX *local_90;
  iterator local_88;
  size_t local_78;
  Entry *local_70;
  EVP_PKEY_CTX *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Entry *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_7e8[0x17] = in_SIL & 1;
  if (((byte)in_RDI[0x4d8] & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RDI + 0xa0));
    std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::
    reserve((vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_> *)
            in_stack_ffffffffffffeae0,CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8))
    ;
    local_7e8._8_8_ = in_RDI + 0xa0;
    local_7e8._0_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffeaa8);
    local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffeaa8);
    while (bVar6 = __gnu_cxx::
                   operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffeab0,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffeaa8), ((bVar6 ^ 0xffU) & 1) != 0) {
      local_840._72_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_7e8);
      local_840._48_16_ =
           (undefined1  [16])
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffeab0);
      name._M_str = in_stack_ffffffffffffeb08;
      name._M_len = (size_t)in_stack_ffffffffffffeb00;
      local_840._64_8_ =
           getSourceLibrary((Compilation *)
                            CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),name);
      if ((SourceLibrary *)local_840._64_8_ != (SourceLibrary *)0x0) {
        std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::
        push_back((vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                   *)in_stack_ffffffffffffeac0,(value_type *)in_stack_ffffffffffffeab8);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_7e8);
    }
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
    ::unordered_flat_map
              ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                *)in_stack_ffffffffffffead0);
    parseParamOverrides(in_stack_fffffffffffffda8,
                        (flat_hash_map<std::string_view,_const_ConstantValue_*> *)
                        CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    if ((local_7e8[0x17] & 1) == 0) {
      local_860[1]._M_current = (shared_ptr<slang::syntax::SyntaxTree> *)(in_RDI + 0x8b8);
      local_860[0]._M_current =
           (shared_ptr<slang::syntax::SyntaxTree> *)
           std::
           vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ::begin((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                    *)in_stack_ffffffffffffeaa8);
      local_868 = std::
                  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                  ::end((vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                         *)in_stack_ffffffffffffeaa8);
      while (bVar6 = __gnu_cxx::
                     operator==<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                               ((__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                                 *)in_stack_ffffffffffffeab0,
                                (__normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
                                 *)in_stack_ffffffffffffeaa8), ((bVar6 ^ 0xffU) & 1) != 0) {
        local_888[1]._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
             ::operator*(local_860);
        std::
        __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x7b5de4);
        local_888[1].func.this =
             (Compilation *)slang::syntax::SyntaxTree::getMetadata((SyntaxTree *)0x7b5dec);
        if (((((ParserMetadata *)local_888[1].func.this)->hasDefparams & 1U) != 0) ||
           ((((ParserMetadata *)local_888[1].func.this)->hasBindDirectives & 1U) != 0)) {
          resolveDefParamsAndBinds((Compilation *)tryAddTop.topDefs);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<slang::syntax::SyntaxTree>_*,_std::vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>_>
        ::operator++(local_860);
      }
    }
    in_RDI[0x4d9] = (EVP_PKEY_CTX)0x1;
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/Compilation.cpp:330:29)>
    ::ScopeGuard(local_888,&local_890);
    local_898 = local_840;
    SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
    ::SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
                   *)0x7b5eb7);
    bVar6 = boost::unordered::
            unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::empty((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)0x7b5ecc);
    if (bVar6) {
      local_908 = in_RDI + 0x238;
      local_918 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::begin((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                           *)0x7b5ef8);
      local_928 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                         *)0x7b5f15);
      while( true ) {
        bVar6 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeab0,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeaa8);
        if (!bVar6) break;
        local_930 = boost::unordered::detail::foa::
                    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)0x7b5f60);
        local_938 = (pointer)std::
                             get<0ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                                       ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                                         *)0x7b5f75);
        local_940 = std::
                    get<1ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                              ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                                *)0x7b5f8a);
        ppSVar15 = std::
                   get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>
                             ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               *)0x7b5f9f);
        pSVar1 = *ppSVar15;
        pRVar26 = std::
                  unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
                  get((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       *)in_stack_ffffffffffffeab0);
        local_1018 = (__tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
                      )0x0;
        if (pRVar26 != (pointer)0x0) {
          local_1018 = &pRVar26->super_Scope;
        }
        if (pSVar1 == local_1018) {
          local_948 = local_940;
          local_950._M_current =
               (Symbol **)
               std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                         ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                          in_stack_ffffffffffffeaa8);
          local_958 = (pointer)std::
                               vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::
                               end((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                                    *)in_stack_ffffffffffffeaa8);
          while (bVar6 = __gnu_cxx::
                         operator==<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                   ((__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                     *)in_stack_ffffffffffffeab0,
                                    (__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                     *)in_stack_ffffffffffffeaa8), ((bVar6 ^ 0xffU) & 1) != 0) {
            ppSVar16 = __gnu_cxx::
                       __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                       ::operator*(&local_950);
            local_960 = *ppSVar16;
            if (local_960->kind == Definition) {
              local_968 = Symbol::as<slang::ast::DefinitionSymbol>(local_960);
              local_1031 = true;
              if ((local_968->sourceLibrary->isDefault & 1U) != 0) {
                pEVar19 = in_RDI + 0x948;
                local_7e8._72_8_ = &(local_968->super_Symbol).name;
                local_7e8._80_8_ = pEVar19;
                local_6e8._64_8_ = local_7e8._72_8_;
                local_6e8._72_8_ = pEVar19;
                local_5d0 = (string_view *)local_7e8._72_8_;
                local_5c8 = pEVar19;
                local_5d8 = (pointer)boost::unordered::detail::foa::
                                     table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                                     ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                               ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                                 *)in_stack_ffffffffffffeab0,
                                                (basic_string_view<char,_std::char_traits<char>_> *)
                                                in_stack_ffffffffffffeaa8);
                psVar3 = local_5d0;
                local_578 = boost::unordered::detail::foa::
                            table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            *)in_stack_ffffffffffffeab0,
                                           (size_t)in_stack_ffffffffffffeaa8);
                local_570 = psVar3;
                local_580 = local_5d8;
                local_568 = pEVar19;
                boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                          (&local_590,local_578);
                do {
                  local_598 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_590);
                  local_5a0 = boost::unordered::detail::foa::
                              table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        *)0x7b6233);
                  local_5a0 = local_5a0 + local_598;
                  local_5a4 = boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::match
                                        ((group15<boost::unordered::detail::foa::plain_integral> *)
                                         in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0
                                        );
                  if (local_5a4 != 0) {
                    local_5b0 = boost::unordered::detail::foa::
                                table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                            *)0x7b6291);
                    local_5b8 = local_5b0 + local_598 * 0xf;
                    do {
                      local_5bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)0x7b62e4);
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                                ((basic_string_view<char,_std::char_traits<char>_> *)0x7b6317);
                      bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                              ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           in_stack_ffffffffffffeac0);
                      if (bVar6) {
                        boost::unordered::detail::foa::
                        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)(local_6e8 + 0x28),local_5a0,local_5bc,
                                        local_5b8 + local_5bc);
                        goto LAB_007b6433;
                      }
                      local_5a4 = local_5a4 - 1 & local_5a4;
                    } while (local_5a4 != 0);
                  }
                  bVar6 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
                  if (bVar6) {
                    memset(local_6e8 + 0x28,0,0x18);
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)(local_6e8 + 0x28));
                    goto LAB_007b6433;
                  }
                  bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                    (&local_590,*(size_t *)(in_RDI + 0x950));
                } while (bVar6);
                memset(local_6e8 + 0x28,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                 *)(local_6e8 + 0x28));
LAB_007b6433:
                local_6e8._80_16_ =
                     (undefined1  [16])
                     boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::make_iterator((locator *)0x7b6442);
                local_7e8._88_8_ = local_6e8._80_8_;
                local_7e8._96_8_ = local_6e8._88_8_;
                local_978 = (Segment *)local_6e8._80_8_;
                local_970 = (table_element_pointer)local_6e8._88_8_;
                local_988 = boost::unordered::
                            unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)0x7b64e6);
                local_1031 = boost::unordered::detail::foa::operator!=
                                       ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                         *)in_stack_ffffffffffffeab0,
                                        (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                         *)in_stack_ffffffffffffeaa8);
              }
              if (local_1031 == false) {
                if ((((local_968->syntaxTree == (SyntaxTree *)0x0) ||
                     ((local_968->syntaxTree->isLibraryUnit & 1U) == 0)) &&
                    ((local_968->definitionKind == Module || (local_968->definitionKind == Program))
                    )) && (bVar6 = getRoot(bool)::$_0::operator()
                                             ((anon_class_8_1_67989ee5 *)
                                              CONCAT17(in_stack_ffffffffffffeb2f,
                                                       in_stack_ffffffffffffeb28),
                                              in_stack_ffffffffffffeb20), bVar6)) {
                  DefinitionLookupResult::DefinitionLookupResult
                            (&local_9c8,&local_968->super_Symbol);
                  SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffeab0);
                  std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>::
                  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange,_true>
                            (&local_9b0,&local_9c8,&local_9d8);
                  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                  ::push_back((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                               *)in_stack_ffffffffffffeab0,
                              (pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                               *)in_stack_ffffffffffffeaa8);
                }
                else {
                  local_9e0 = local_968;
                  std::
                  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  ::push_back((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                               *)in_stack_ffffffffffffeab0,(value_type *)in_stack_ffffffffffffeaa8);
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
            ::operator++(&local_950);
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_ffffffffffffeab0);
      }
    }
    else {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                  *)in_stack_ffffffffffffeac0);
      local_aa0 = local_a88;
      local_a98 = &local_900;
      local_aa8 = in_RDI + 0x58;
      local_ab8 = boost::unordered::
                  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::begin((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)0x7b66c4);
      local_ac8 = (size_ctrl_type)
                  boost::unordered::
                  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)0x7b66e1);
      while( true ) {
        bVar6 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_ffffffffffffeab0,
                           (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_ffffffffffffeaa8);
        if (!bVar6) break;
        pbVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 ::operator*((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_ffffffffffffeab0);
        local_ae8._M_len = pbVar9->_M_len;
        local_ae8._M_str = pbVar9->_M_str;
        local_af0 = (SourceLibrary *)0x0;
        local_ad8 = (Type *)local_ae8._M_len;
        pTStack_ad0 = (Type *)local_ae8._M_str;
        local_af8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               in_stack_ffffffffffffeae0,in_stack_ffffffffffffeadf,
                               (size_type)in_stack_ffffffffffffead0);
        bVar27 = local_b38;
        if (local_af8 == 0xffffffffffffffff) {
LAB_007b694e:
          local_b39 = 0;
          local_b50._M_len = 7;
          local_b50._M_str = ":config";
          local_b60 = (pointer)0x7;
          local_b58 = ":config";
          __x._M_len._7_1_ = in_stack_ffffffffffffeadf;
          __x._M_len._0_7_ = in_stack_ffffffffffffead8;
          __x._M_str = (char *)in_stack_ffffffffffffeae0;
          local_b38 = bVar27;
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                            (in_stack_ffffffffffffead0,__x);
          if (bVar6) {
            local_b39 = 1;
            std::basic_string_view<char,_std::char_traits<char>_>::length(&local_ae8);
            std::basic_string_view<char,_std::char_traits<char>_>::length(&local_b50);
            bVar27 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (in_stack_ffffffffffffead0,(size_type)in_stack_ffffffffffffeac8,
                                (size_type)in_stack_ffffffffffffeac0);
            local_b70 = bVar27;
            local_ae8 = bVar27;
          }
          if ((local_b39 & 1) == 0) {
            ppVar10 = (pointer)(in_RDI + 0x238);
            local_bb8 = std::
                        unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                        ::get((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                               *)in_stack_ffffffffffffeab0);
            std::
            tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>::
            tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_slang::ast::RootSymbol_*,_true>
                      ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>
                        *)in_stack_ffffffffffffeab0,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffeaa8
                       ,(RootSymbol **)0x7b6aba);
            std::
            tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            ::
            tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*,_true>
                      ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        *)in_stack_ffffffffffffeab0,
                       (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>
                        *)in_stack_ffffffffffffeaa8);
            local_7e8._104_8_ = &local_b98;
            local_7e8._112_8_ = ppVar10;
            local_498 = &local_b98;
            local_490 = ppVar10;
            local_470 = &local_b98;
            local_468 = ppVar10;
            local_478 = (pointer)boost::unordered::detail::foa::
                                 table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                                 ::
                                 hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                                             *)in_stack_ffffffffffffeab0,
                                            (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             *)in_stack_ffffffffffffeaa8);
            ppVar4 = local_470;
            local_418 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                                        *)in_stack_ffffffffffffeab0,
                                       (size_t)in_stack_ffffffffffffeaa8);
            local_410 = ppVar4;
            local_420 = local_478;
            local_408 = ppVar10;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_430,local_418);
            do {
              local_438 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_430);
              local_440 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                          ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                                    *)0x7b6c24);
              local_440 = local_440 + local_438;
              local_444 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::match
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
              if (local_444 != 0) {
                local_450 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                            ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                                        *)0x7b6c82);
                local_458 = local_450 + local_438 * 0xf;
                do {
                  local_45c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                          *)0x7b6cd5);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
                  ::
                  key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>
                            ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                              *)0x7b6d08);
                  bVar6 = std::
                          equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                          ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                                        *)in_stack_ffffffffffffeab0,
                                       (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                        *)in_stack_ffffffffffffeaa8,
                                       (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                        *)0x7b6d2f);
                  if (bVar6) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                    ::table_locator(&local_4b0,local_440,local_45c,local_458 + local_45c);
                    goto LAB_007b6e34;
                  }
                  local_444 = local_444 - 1 & local_444;
                } while (local_444 != 0);
              }
              bVar6 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
              if (bVar6) {
                memset(&local_4b0,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                ::table_locator(&local_4b0);
                goto LAB_007b6e34;
              }
              bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_430,*(size_t *)(in_RDI + 0x240));
            } while (bVar6);
            memset(&local_4b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
            ::table_locator(&local_4b0);
LAB_007b6e34:
            local_488 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                        ::make_iterator((locator *)0x7b6e45);
            local_7e8._120_8_ = local_488.pc_;
            local_7e8._128_8_ = local_488.p_;
            local_b80 = (pointer)local_488.pc_;
            local_b78 = local_488.p_;
            local_bc8 = boost::unordered::
                        unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                        ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                               *)0x7b6ee9);
            bVar6 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_ffffffffffffeab0,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_ffffffffffffeaa8);
            if (bVar6) {
              local_bd0 = (DefinitionSymbol *)0x0;
              ppVar11 = boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)0x7b6f40);
              local_bd8 = (value_type_pointer)&ppVar11->second;
              local_be0._M_current =
                   (Symbol **)
                   std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                             ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *
                              )in_stack_ffffffffffffeaa8);
              local_be8 = (Symbol **)
                          std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::
                          end((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *
                              )in_stack_ffffffffffffeaa8);
              while( true ) {
                bVar6 = __gnu_cxx::
                        operator==<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                  ((__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                    *)in_stack_ffffffffffffeab0,
                                   (__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                    *)in_stack_ffffffffffffeaa8);
                pDVar29 = local_bd0;
                if (((bVar6 ^ 0xffU) & 1) == 0) break;
                ppSVar16 = __gnu_cxx::
                           __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                           ::operator*(&local_be0);
                local_bf0 = *ppSVar16;
                if (local_bf0->kind == Definition) {
                  local_bf8 = Symbol::as<slang::ast::DefinitionSymbol>(local_bf0);
                  pDVar29 = local_bf8;
                  if ((local_bf8->sourceLibrary == local_af0) ||
                     ((local_af0 == (SourceLibrary *)0x0 &&
                      (pDVar29 = local_bf8, (local_bf8->sourceLibrary->isDefault & 1U) != 0))))
                  break;
                }
                __gnu_cxx::
                __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                ::operator++(&local_be0);
              }
              local_bd0 = pDVar29;
              if (local_bd0 != (DefinitionSymbol *)0x0) {
                if ((local_bd0->definitionKind == Module) || (local_bd0->definitionKind == Program))
                {
                  bVar6 = getRoot(bool)::$_0::operator()
                                    ((anon_class_8_1_67989ee5 *)
                                     CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                                     in_stack_ffffffffffffeb20);
                  if (bVar6) {
                    DefinitionLookupResult::DefinitionLookupResult
                              (&local_c10,&local_bd0->super_Symbol);
                    SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffeab0);
                    result_00.configRoot = (ConfigBlockSymbol *)in_stack_ffffffffffffed68;
                    result_00.definition = (Symbol *)in_stack_ffffffffffffed60;
                    result_00.configRule._0_4_ = in_stack_ffffffffffffed70;
                    result_00.configRule._4_4_ = in_stack_ffffffffffffed74;
                    sourceRange.endLoc._0_4_ = in_stack_ffffffffffffebe8;
                    sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffebe0;
                    sourceRange.endLoc._4_4_ = in_stack_ffffffffffffebec;
                    in_stack_ffffffffffffeaa8 = (Compilation *)local_c10.definition;
                    in_stack_ffffffffffffeab0 = local_c10.configRoot;
                    in_stack_ffffffffffffeab8 = local_c10.configRule;
                    getRoot::anon_class_24_3_d9e6786c::operator()
                              (in_stack_ffffffffffffebd8,result_00,sourceRange);
                    goto LAB_007b78bd;
                  }
                }
                Symbol::getParentScope(&local_bd0->super_Symbol);
                local_c24 = 0x10000d;
                local_c30 = 0xffffffffffffffff;
                Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffeb57,in_stack_ffffffffffffeb50
                                                ),SUB84((ulong)in_stack_ffffffffffffeb60 >> 0x20,0),
                               in_stack_ffffffffffffeb58);
                local_c48 = local_ad8;
                pTStack_c40 = pTStack_ad0;
                arg_00._M_len._7_1_ = in_stack_ffffffffffffeaff;
                arg_00._M_len._0_7_ = in_stack_ffffffffffffeaf8;
                arg_00._M_str = (char *)in_stack_ffffffffffffeb00;
                Diagnostic::operator<<(in_stack_ffffffffffffeaf0,arg_00);
                goto LAB_007b78bd;
              }
            }
          }
          pEVar19 = in_RDI + 0xae0;
          local_7e8._136_8_ = &local_ae8;
          local_7e8._144_8_ = pEVar19;
          local_3e8 = (basic_string_view<char,_std::char_traits<char>_> *)local_7e8._136_8_;
          local_3e0 = pEVar19;
          local_3c0 = (basic_string_view<char,_std::char_traits<char>_> *)local_7e8._136_8_;
          local_3b8 = pEVar19;
          local_3c8 = (group_type_pointer)
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                      ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                  *)in_stack_ffffffffffffeab0,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_ffffffffffffeaa8);
          pbVar2 = local_3c0;
          local_368 = (group_type_pointer)
                      boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                      ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                      *)in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8)
          ;
          local_360 = pbVar2;
          local_370 = local_3c8;
          local_358 = pEVar19;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_380,(size_t)local_368);
          do {
            local_388 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_380);
            pgVar12 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                      ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                *)0x7b72e8);
            local_390 = (value_type_pointer)(pgVar12 + local_388);
            local_394 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::match
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
            if (local_394 != 0) {
              local_3a0 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                          ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                                      *)0x7b7346);
              local_3a8 = local_3a0 + local_388 * 0xf;
              do {
                local_3ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                        *)0x7b7399);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::vector<slang::ast::ConfigBlockSymbol_const*,std::allocator<slang::ast::ConfigBlockSymbol_const*>>>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                            *)0x7b73cd);
                bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffeac0);
                if (bVar6) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                  ::table_locator(&local_400,
                                  (group15<boost::unordered::detail::foa::plain_integral> *)
                                  local_390,local_3ac,local_3a8 + local_3ac);
                  goto LAB_007b74e9;
                }
                local_394 = local_394 - 1 & local_394;
              } while (local_394 != 0);
            }
            bVar6 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
            if (bVar6) {
              memset(&local_400,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
              ::table_locator(&local_400);
              goto LAB_007b74e9;
            }
            bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_380,*(size_t *)(in_RDI + 0xae8));
          } while (bVar6);
          memset(&local_400,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
          ::table_locator(&local_400);
LAB_007b74e9:
          local_3d8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                      ::make_iterator((locator *)0x7b74fa);
          local_7e8._152_8_ = local_3d8.pc_;
          local_7e8._160_8_ = local_3d8.p_;
          local_c58 = local_3d8.pc_;
          local_c50 = local_3d8.p_;
          local_c68 = boost::unordered::
                      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
                             *)0x7b759e);
          bVar6 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_ffffffffffffeab0,
                             (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                              *)in_stack_ffffffffffffeaa8);
          if (bVar6) {
            local_c70 = (ConfigBlockSymbol *)0x0;
            ppVar13 = boost::unordered::detail::foa::
                      table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                    *)in_stack_ffffffffffffeab0);
            local_c78 = &ppVar13->second;
            local_c80._M_current =
                 (ConfigBlockSymbol **)
                 std::
                 vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                 ::begin((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                          *)in_stack_ffffffffffffeaa8);
            local_c88 = (ConfigBlockSymbol **)
                        std::
                        vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                        ::end((vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                               *)in_stack_ffffffffffffeaa8);
            while( true ) {
              bVar6 = __gnu_cxx::
                      operator==<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                                ((__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                                  *)in_stack_ffffffffffffeab0,
                                 (__normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                                  *)in_stack_ffffffffffffeaa8);
              if (((bVar6 ^ 0xffU) & 1) == 0) break;
              ppCVar14 = __gnu_cxx::
                         __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
                         ::operator*(&local_c80);
              local_c90 = *ppCVar14;
              local_c98 = Symbol::getSourceLibrary((Symbol *)in_stack_ffffffffffffeab8);
              if ((local_c98 == local_af0) ||
                 ((local_af0 == (SourceLibrary *)0x0 && ((local_c98->isDefault & 1U) != 0)))) {
                local_c70 = local_c90;
                break;
              }
              __gnu_cxx::
              __normal_iterator<const_slang::ast::ConfigBlockSymbol_**,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>
              ::operator++(&local_c80);
            }
            if (local_c70 != (ConfigBlockSymbol *)0x0) {
              local_c70->isUsed = true;
              sVar28 = ConfigBlockSymbol::getTopCells
                                 ((ConfigBlockSymbol *)in_stack_ffffffffffffeaa8);
              local_ca0 = &local_cb0;
              local_cb0 = sVar28;
              local_cb8._M_current =
                   (TopCell *)
                   std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>::
                   begin((span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>
                          *)in_stack_ffffffffffffeaa8);
              local_cc0 = (TopCell *)
                          std::
                          span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>
                          ::end((span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>
                                 *)in_stack_ffffffffffffeab8);
              while( true ) {
                bVar6 = __gnu_cxx::
                        operator==<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
                                  ((__normal_iterator<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
                                    *)in_stack_ffffffffffffeab0,
                                   (__normal_iterator<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
                                    *)in_stack_ffffffffffffeaa8);
                if (((bVar6 ^ 0xffU) & 1) == 0) break;
                local_cc8 = __gnu_cxx::
                            __normal_iterator<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
                            ::operator*(&local_cb8);
                DefinitionLookupResult::DefinitionLookupResult
                          (&local_ce0,&local_cc8->definition->super_Symbol,local_c70,local_cc8->rule
                          );
                local_cf8 = (local_cc8->sourceRange).startLoc;
                SStack_cf0 = (local_cc8->sourceRange).endLoc;
                result_01.configRoot = (ConfigBlockSymbol *)in_stack_ffffffffffffed68;
                result_01.definition = (Symbol *)in_stack_ffffffffffffed60;
                result_01.configRule._0_4_ = in_stack_ffffffffffffed70;
                result_01.configRule._4_4_ = in_stack_ffffffffffffed74;
                sourceRange_00.endLoc._0_4_ = in_stack_ffffffffffffebe8;
                sourceRange_00.startLoc = (SourceLocation)in_stack_ffffffffffffebe0;
                sourceRange_00.endLoc._4_4_ = in_stack_ffffffffffffebec;
                in_stack_ffffffffffffeaa8 = (Compilation *)local_ce0.definition;
                in_stack_ffffffffffffeab0 = local_ce0.configRoot;
                in_stack_ffffffffffffeab8 = local_ce0.configRule;
                getRoot::anon_class_24_3_d9e6786c::operator()
                          (in_stack_ffffffffffffebd8,result_01,sourceRange_00);
                __gnu_cxx::
                __normal_iterator<const_slang::ast::ConfigBlockSymbol::TopCell_*,_std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>_>
                ::operator++(&local_cb8);
              }
              goto LAB_007b78bd;
            }
          }
          std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
          operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                      *)0x7b784a);
          local_cfc = 0x10000d;
          local_d08 = (Type *)0xffffffffffffffff;
          Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffeb57,in_stack_ffffffffffffeb50),
                         SUB84((ulong)in_stack_ffffffffffffeb60 >> 0x20,0),in_stack_ffffffffffffeb58
                        );
          local_d18 = local_ad8;
          pTStack_d10 = pTStack_ad0;
          arg_01._M_len._7_1_ = in_stack_ffffffffffffeaff;
          arg_01._M_len._0_7_ = in_stack_ffffffffffffeaf8;
          arg_01._M_str = (char *)in_stack_ffffffffffffeb00;
          Diagnostic::operator<<(in_stack_ffffffffffffeaf0,arg_01);
        }
        else {
          bVar27 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (in_stack_ffffffffffffead0,(size_type)in_stack_ffffffffffffeac8,
                              (size_type)in_stack_ffffffffffffeac0);
          name_00._M_str = in_stack_ffffffffffffeb08;
          name_00._M_len = (size_t)in_stack_ffffffffffffeb00;
          local_b08 = bVar27;
          local_af0 = getSourceLibrary((Compilation *)
                                       CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
                                       ,name_00);
          if (local_af0 != (SourceLibrary *)0x0) {
            bVar27 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (in_stack_ffffffffffffead0,(size_type)in_stack_ffffffffffffeac8,
                                (size_type)in_stack_ffffffffffffeac0);
            local_ae8 = bVar27;
            goto LAB_007b694e;
          }
          std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
          operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                      *)0x7b6841);
          local_b0c = 0x10000d;
          local_b18 = 0xffffffffffffffff;
          Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffeb57,in_stack_ffffffffffffeb50),
                         SUB84((ulong)in_stack_ffffffffffffeb60 >> 0x20,0),in_stack_ffffffffffffeb58
                        );
          local_b28 = local_ad8;
          pTStack_b20 = pTStack_ad0;
          arg._M_len._7_1_ = in_stack_ffffffffffffeaff;
          arg._M_len._0_7_ = in_stack_ffffffffffffeaf8;
          arg._M_str = (char *)in_stack_ffffffffffffeb00;
          Diagnostic::operator<<(in_stack_ffffffffffffeaf0,arg);
        }
LAB_007b78bd:
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_ffffffffffffeab0);
      }
      local_d20 = (Type *)(in_RDI + 0x238);
      local_d30 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::begin((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                           *)0x7b78f2);
      local_d40 = boost::unordered::
                  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                  ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                         *)0x7b790f);
      while( true ) {
        bVar6 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeab0,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeaa8);
        if (!bVar6) break;
        local_d48 = (Type *)boost::unordered::detail::foa::
                            table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                         *)0x7b795a);
        local_d50 = (Type *)std::
                            get<0ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                                      ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                                        *)0x7b796f);
        local_d58 = (Type *)std::
                            get<1ul,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                                      ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                                        *)0x7b7984);
        ppSVar15 = std::
                   get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>
                             ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               *)0x7b7999);
        pSVar1 = *ppSVar15;
        pRVar26 = std::
                  unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
                  get((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       *)in_stack_ffffffffffffeab0);
        local_1250 = (__tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_const_Scope_*>_>
                      )0x0;
        if (pRVar26 != (pointer)0x0) {
          local_1250 = &pRVar26->super_Scope;
        }
        if (pSVar1 == local_1250) {
          local_d60 = local_d58;
          local_d68._M_current =
               (Symbol **)
               std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                         ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                          in_stack_ffffffffffffeaa8);
          local_d70 = (Type *)std::
                              vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::
                              end((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                                   *)in_stack_ffffffffffffeaa8);
          while( true ) {
            bVar6 = __gnu_cxx::
                    operator==<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                              ((__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                *)in_stack_ffffffffffffeab0,
                               (__normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                                *)in_stack_ffffffffffffeaa8);
            if (((bVar6 ^ 0xffU) & 1) == 0) break;
            ppSVar16 = __gnu_cxx::
                       __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                       ::operator*(&local_d68);
            local_d78 = (Type *)*ppSVar16;
            if ((local_d78->super_Symbol).kind == Definition) {
              local_d80 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)local_d78);
              pEVar19 = in_RDI + 0x948;
              local_7e8._40_8_ = &(local_d80->super_Symbol).name;
              local_7e8._48_8_ = pEVar19;
              local_688[1].pg =
                   (group15<boost::unordered::detail::foa::plain_integral> *)local_7e8._40_8_;
              local_688[1]._8_8_ = pEVar19;
              local_688[2].p = (basic_string_view<char,_std::char_traits<char>_> *)local_7e8._40_8_;
              local_688[3].pg = (group15<boost::unordered::detail::foa::plain_integral> *)pEVar19;
              local_688[2]._8_8_ =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)in_stack_ffffffffffffeab0,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffeaa8);
              pbVar2 = local_688[2].p;
              local_5f0 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          *)in_stack_ffffffffffffeab0,
                                         (size_t)in_stack_ffffffffffffeaa8);
              local_5e8 = pbVar2;
              local_5f8 = local_688[2]._8_8_;
              local_5e0 = pEVar19;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_608,local_5f0);
              do {
                local_610 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_608);
                pgVar17 = boost::unordered::detail::foa::
                          table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    *)0x7b7bf2);
                local_688[4].p =
                     (basic_string_view<char,_std::char_traits<char>_> *)(pgVar17 + local_610);
                local_688[4]._12_4_ =
                     boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
                if (local_688[4]._12_4_ != 0) {
                  local_688[4].pg =
                       (group15<boost::unordered::detail::foa::plain_integral> *)
                       boost::unordered::detail::foa::
                       table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)0x7b7c50);
                  local_688[3].p = (value_type *)local_688[4].pg + local_610 * 0xf;
                  do {
                    local_688[3]._12_4_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x7b7ca3);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                              ((basic_string_view<char,_std::char_traits<char>_> *)0x7b7cd6);
                    bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                            operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                        *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       in_stack_ffffffffffffeac0);
                    if (bVar6) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      ::table_locator(local_688,
                                      (group15<boost::unordered::detail::foa::plain_integral> *)
                                      local_688[4].p,local_688[3]._12_4_,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      ((long)local_688[3].p +
                                      (ulong)(uint)local_688[3]._12_4_ * 0x10));
                      goto LAB_007b7df2;
                    }
                    local_688[4]._12_4_ = local_688[4]._12_4_ - 1 & local_688[4]._12_4_;
                  } while (local_688[4]._12_4_ != 0);
                }
                bVar6 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
                if (bVar6) {
                  memset(local_688,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ::table_locator(local_688);
                  goto LAB_007b7df2;
                }
                bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_608,*(size_t *)(in_RDI + 0x950));
              } while (bVar6);
              memset(local_688,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ::table_locator(local_688);
LAB_007b7df2:
              local_688._40_16_ =
                   (undefined1  [16])
                   boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::make_iterator((locator *)0x7b7e01);
              local_7e8._56_8_ = local_688[1].p;
              local_7e8._64_8_ = local_688[2].pg;
              local_d90 = (BumpAllocator *)local_688[1].p;
              local_d88 = (table_element_pointer)local_688[2].pg;
              local_da0 = (allocator_type)
                          boost::unordered::
                          unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ::end((unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)0x7b7ea5);
              bVar7 = boost::unordered::detail::foa::operator==
                                ((table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                  *)in_stack_ffffffffffffeab0,
                                 (table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                  *)in_stack_ffffffffffffeaa8);
              bVar6 = false;
              if ((bVar7) && (bVar6 = false, (local_d80->sourceLibrary->isDefault & 1U) != 0)) {
                sVar18 = DefinitionSymbol::getInstanceCount(local_d80);
                bVar6 = sVar18 == 0;
              }
              if (bVar6) {
                local_da8 = local_d80;
                std::
                vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                ::push_back((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                             *)in_stack_ffffffffffffeab0,(value_type *)in_stack_ffffffffffffeaa8);
              }
            }
            __gnu_cxx::
            __normal_iterator<slang::ast::Symbol_**,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
            ::operator++(&local_d68);
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_ffffffffffffeab0);
      }
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>_>
                   *)0x7b7fa7);
    }
    std::ranges::__sort_fn::
    operator()<slang::SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:516:32),_std::identity>
              ((__sort_fn *)&std::ranges::sort,&local_900);
    local_db8 = (DefinitionSymbol **)
                std::ranges::__sort_fn::
                operator()<std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:519:41),_std::identity>
                          ((__sort_fn *)&std::ranges::sort,in_RDI + 0x8d0);
    bVar6 = boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
            ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                     *)0x7b7fff);
    if (!bVar6) {
      local_dc0 = &local_900;
      local_dc8 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                  ::begin(local_dc0);
      local_dd0 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                  ::end(local_dc0);
      for (; local_dc8 != local_dd0; local_dc8 = local_dc8 + 1) {
        local_dd8 = (local_dc8->second).endLoc;
        local_df8 = (local_dc8->first).definition;
        pCStack_df0 = (local_dc8->first).configRoot;
        local_de8 = (local_dc8->first).configRule;
        SStack_de0 = (local_dc8->second).startLoc;
        local_e00 = (pointer)std::
                             get<0ul,slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>
                                       ((pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                                         *)0x7b8097);
        local_e08 = std::get<1ul,slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>
                              ((pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                                *)0x7b80ac);
        local_e10 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x7b80c4);
        local_e18 = &(local_e10->parameters).
                     super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>;
        local_e20 = SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::begin(local_e18);
        local_e28 = SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::end(local_e18);
        for (; local_e20 != local_e28; local_e20 = local_e20 + 1) {
          local_e30 = local_e20;
          if (((local_e20->isTypeParam & 1U) == 0) && ((local_e20->hasSyntax & 1U) != 0)) {
            local_7e8._168_8_ = &local_e20->name;
            local_7e8._176_8_ = local_840;
            local_548 = (string_view *)local_7e8._168_8_;
            local_540 = local_840;
            local_520 = (string_view *)local_7e8._168_8_;
            local_518 = local_840;
            local_528 = (value_type_pointer)
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                        ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                                    *)in_stack_ffffffffffffeab0,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_ffffffffffffeaa8);
            psVar3 = local_520;
            local_4c8 = (value_type_pointer)
                        boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                        ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                                        *)in_stack_ffffffffffffeab0,
                                       (size_t)in_stack_ffffffffffffeaa8);
            local_4c0 = psVar3;
            local_4d0 = local_528;
            local_4b8 = local_840;
            boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                      (&local_4e0,(size_t)local_4c8);
            do {
              local_4e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_4e0);
              local_4f0 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                          ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                                    *)0x7b82b7);
              local_4f0 = local_4f0 + local_4e8;
              local_4f4 = boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::match
                                    ((group15<boost::unordered::detail::foa::plain_integral> *)
                                     in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
              if (local_4f4 != 0) {
                local_500 = boost::unordered::detail::foa::
                            table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                            ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                                        *)0x7b8315);
                local_508 = local_500 + local_4e8 * 0xf;
                do {
                  local_50c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                          *)0x7b8368);
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                  ::
                  key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>
                              *)0x7b839c);
                  bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                          operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                      *)in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     in_stack_ffffffffffffeac0);
                  if (bVar6) {
                    boost::unordered::detail::foa::
                    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                    ::table_locator(&local_560,local_4f0,local_50c,local_508 + local_50c);
                    goto LAB_007b84b8;
                  }
                  local_4f4 = local_4f4 - 1 & local_4f4;
                } while (local_4f4 != 0);
              }
              bVar6 = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
              if (bVar6) {
                memset(&local_560,0,0x18);
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                ::table_locator(&local_560);
                goto LAB_007b84b8;
              }
              bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                (&local_4e0,local_840._8_8_);
            } while (bVar6);
            memset(&local_560,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
            ::table_locator(&local_560);
LAB_007b84b8:
            local_538 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                        ::make_iterator((locator *)0x7b84c9);
            local_7e8._184_8_ = local_538.pc_;
            local_7e8._192_8_ = local_538.p_;
            local_e40 = local_538.pc_;
            local_e38 = local_538.p_;
            local_e58._8_16_ =
                 (undefined1  [16])
                 boost::unordered::
                 unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                 ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                        *)0x7b8566);
            bVar6 = boost::unordered::detail::foa::operator!=
                              ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_ffffffffffffeab0,
                               (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_ffffffffffffeaa8);
            if (bVar6) {
              pEVar19 = in_RDI + 0x9a8;
              pSVar20 = Symbol::getSyntax(&local_e10->super_Symbol);
              OpaqueInstancePath::Entry::Entry((Entry *)local_e58,pSVar20);
              local_7e8._224_8_ = local_e58;
              local_288 = &local_349;
              local_7e8._232_8_ = pEVar19;
              local_348 = (value_type_pointer)local_7e8._224_8_;
              local_340 = pEVar19;
              local_290 = (value_type_pointer)local_7e8._224_8_;
              local_280 = pEVar19;
              local_298 = (group_type_pointer)
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          ::key_from<slang::ast::OpaqueInstancePath::Entry>(local_7e8._224_8_);
              local_2a0 = (SourceLibrary *)
                          boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          ::hash_for<slang::ast::OpaqueInstancePath::Entry>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                      *)in_stack_ffffffffffffeab0,(Entry *)in_stack_ffffffffffffeaa8
                                    );
              local_2a8 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                          *)in_stack_ffffffffffffeab0,
                                         (size_t)in_stack_ffffffffffffeaa8);
              local_228 = local_298;
              local_238 = local_2a0;
              local_230 = local_2a8;
              local_220 = pEVar19;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_248,local_2a8);
              do {
                sVar21 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_248);
                pgVar22 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          ::groups((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                    *)0x7b8762);
                pgVar22 = pgVar22 + sVar21;
                uVar8 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::match
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
                if (uVar8 != 0) {
                  local_268 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                              ::elements((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                          *)0x7b87c0);
                  local_270 = local_268 + sVar21 * 0xf;
                  do {
                    local_274 = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            *)0x7b8813);
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                    ::
                    key_from<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>
                              ((pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                                *)0x7b8846);
                    bVar6 = std::equal_to<slang::ast::OpaqueInstancePath::Entry>::operator()
                                      ((equal_to<slang::ast::OpaqueInstancePath::Entry> *)
                                       in_stack_ffffffffffffeab0,(Entry *)in_stack_ffffffffffffeaa8,
                                       (Entry *)0x7b886d);
                    if (bVar6) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
                      ::table_locator(&local_2c0,pgVar22,local_274,local_270 + local_274);
                      goto LAB_007b8962;
                    }
                    uVar8 = uVar8 - 1 & uVar8;
                  } while (uVar8 != 0);
                }
                bVar6 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
                if (bVar6) {
                  memset(&local_2c0,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
                  ::table_locator(&local_2c0);
                  goto LAB_007b8962;
                }
                bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_248,*(size_t *)(in_RDI + 0x9b0));
              } while (bVar6);
              memset(&local_2c0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
              ::table_locator(&local_2c0);
LAB_007b8962:
              bVar6 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_2c0);
              if (bVar6) {
                local_2d0 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            ::make_iterator((locator *)0x7b8982);
                local_2d1 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)(local_7e8 + 200),&local_2d0,&local_2d1);
              }
              else if (*(ulong *)(in_RDI + 0x9d0) < *(ulong *)(in_RDI + 0x9c8)) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                ::
                unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            *)in_stack_ffffffffffffeae0,
                           CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
                           (size_t)in_stack_ffffffffffffead0,
                           (try_emplace_args_t *)in_stack_ffffffffffffeac8,
                           (Entry *)in_stack_ffffffffffffeac0);
                local_2e8 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            ::make_iterator((locator *)0x7b8a12);
                local_301[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)(local_7e8 + 200),&local_2e8,local_301);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
                          (in_stack_ffffffffffffeb30,
                           CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                           (try_emplace_args_t *)in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18
                          );
                local_318 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                            ::make_iterator((locator *)0x7b8a85);
                local_331[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)(local_7e8 + 200),&local_318,local_331);
              }
              ppVar23 = boost::unordered::detail::foa::
                        table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                      *)in_stack_ffffffffffffeab0);
              pHVar24 = &ppVar23->second;
              paVar25 = &local_e30->field_1;
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
              ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)in_stack_ffffffffffffeab0);
              local_e90 = 0;
              std::pair<slang::ConstantValue,_std::nullptr_t>::pair<std::nullptr_t,_true>
                        (in_stack_ffffffffffffeac0,(ConstantValue *)in_stack_ffffffffffffeab8,
                         (void **)in_stack_ffffffffffffeab0);
              local_7e8._240_8_ = &stack0xfffffffffffff178;
              local_6f0 = paVar25;
              local_6e8._0_8_ = pHVar24;
              local_1f0 = (Compilation *)local_7e8._240_8_;
              local_1e8 = paVar25;
              local_1e0 = pHVar24;
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
              ::al((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                    *)0x7b8ba4);
              boost::unordered::detail::foa::
              alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
              ::alloc_cted_or_fwded_key_type
                        ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
                          *)in_stack_ffffffffffffeab0,
                         (allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
                          *)in_stack_ffffffffffffeaa8,(DeclaratorSyntax **)0x7b8bbc);
              local_128 = boost::unordered::detail::foa::
                          alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
                          ::move_or_fwd((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
                                         *)0x7b8bcb);
              local_120 = local_201;
              local_130 = local_1f0;
              local_118 = pHVar24;
              local_138 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                          ::
                          key_from<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
                                    (local_128,local_1f0);
              local_140 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                          ::hash_for<slang::syntax::SyntaxNode_const*>
                                    ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                      *)in_stack_ffffffffffffeab0,
                                     (SyntaxNode **)in_stack_ffffffffffffeaa8);
              local_148 = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                          ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                          *)in_stack_ffffffffffffeab0,
                                         (size_t)in_stack_ffffffffffffeaa8);
              local_c0 = local_138;
              local_d0 = local_140;
              local_c8 = local_148;
              local_b8 = pHVar24;
              boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                        (&local_e0,local_148);
              do {
                local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
                local_f0 = boost::unordered::detail::foa::
                           table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                           ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                     *)0x7b8d27);
                local_f0 = local_f0 + local_e8;
                local_f4 = boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::match
                                     ((group15<boost::unordered::detail::foa::plain_integral> *)
                                      in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
                if (local_f4 != 0) {
                  local_100 = boost::unordered::detail::foa::
                              table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                              ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                          *)0x7b8d85);
                  local_108 = local_100 + local_e8 * 0xf;
                  do {
                    local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                    this_00 = boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                      *)0x7b8dd8);
                    __x_00 = local_c0;
                    __y = boost::unordered::detail::foa::
                          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                          ::
                          key_from<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>
                                    ((pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>
                                      *)0x7b8e0b);
                    bVar6 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                                      (this_00,__x_00,__y);
                    if (bVar6) {
                      boost::unordered::detail::foa::
                      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
                      ::table_locator(&local_160,local_f0,local_10c,local_108 + local_10c);
                      goto LAB_007b8f27;
                    }
                    local_f4 = local_f4 - 1 & local_f4;
                  } while (local_f4 != 0);
                }
                bVar6 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
                if (bVar6) {
                  memset(&local_160,0,0x18);
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
                  ::table_locator(&local_160);
                  goto LAB_007b8f27;
                }
                bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                                  (&local_e0,
                                   (ppVar23->second).paramOverrides.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                   .arrays.groups_size_mask);
              } while (bVar6);
              memset(&local_160,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
              ::table_locator(&local_160);
LAB_007b8f27:
              bVar6 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                                ((table_locator *)&local_160);
              if (bVar6) {
                local_170 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                            ::make_iterator((locator *)0x7b8f47);
                local_171 = false;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ea8,&local_170,&local_171);
              }
              else if ((ppVar23->second).paramOverrides.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                       .size_ctrl.size <
                       (ppVar23->second).paramOverrides.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                       .size_ctrl.ml) {
                in_stack_ffffffffffffeaa8 = local_130;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                ::
                unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                            *)in_stack_ffffffffffffeae0,
                           CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8),
                           (size_t)in_stack_ffffffffffffead0,
                           (try_emplace_args_t *)in_stack_ffffffffffffeac8,
                           (SyntaxNode **)in_stack_ffffffffffffeac0,
                           (pair<slang::ConstantValue,_std::nullptr_t> *)in_stack_ffffffffffffeaf0);
                local_188 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                            ::make_iterator((locator *)0x7b8fe9);
                local_1a1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ea8,&local_188,local_1a1);
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
                          (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb38,
                           (try_emplace_args_t *)in_stack_ffffffffffffeb30,
                           (SyntaxNode **)
                           CONCAT17(in_stack_ffffffffffffeb2f,in_stack_ffffffffffffeb28),
                           (pair<slang::ConstantValue,_std::nullptr_t> *)in_stack_ffffffffffffeb20);
                local_1b8 = boost::unordered::detail::foa::
                            table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                            ::make_iterator((locator *)0x7b9064);
                local_1d1[0] = true;
                std::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                ::
                pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                          (&local_ea8,&local_1b8,local_1d1);
              }
              boost::unordered::detail::foa::
              alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
              ::~alloc_cted_or_fwded_key_type
                        ((alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
                          *)0x7b90e9);
              std::pair<slang::ConstantValue,_std::nullptr_t>::~pair
                        ((pair<slang::ConstantValue,_std::nullptr_t> *)0x7b90f8);
            }
          }
        }
      }
    }
    SmallVector<const_slang::ast::InstanceSymbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> *)0x7b9187);
    local_ef0 = &local_900;
    local_ef8 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                ::begin(local_ef0);
    local_f00 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                ::end(local_ef0);
    for (; code = SUB84((ulong)in_stack_ffffffffffffeb60 >> 0x20,0), local_ef8 != local_f00;
        local_ef8 = local_ef8 + 1) {
      local_f08 = (local_ef8->second).endLoc;
      local_f28 = (local_ef8->first).definition;
      pCStack_f20 = (local_ef8->first).configRoot;
      local_f18 = (local_ef8->first).configRule;
      SStack_f10 = (local_ef8->second).startLoc;
      local_f30 = std::get<0ul,slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>
                            ((pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                              *)0x7b9217);
      local_f38 = std::get<1ul,slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>
                            ((pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                              *)0x7b922c);
      local_f40 = Symbol::as<slang::ast::DefinitionSymbol>((Symbol *)0x7b9244);
      local_f48 = (DefinitionSymbol *)0x0;
      pEVar19 = in_RDI + 0x9a8;
      pSVar20 = Symbol::getSyntax(&local_f40->super_Symbol);
      OpaqueInstancePath::Entry::Entry(&local_f60,pSVar20);
      local_6e8._8_8_ = &local_f60;
      local_6e8._16_8_ = pEVar19;
      local_98 = (Entry *)local_6e8._8_8_;
      local_90 = pEVar19;
      local_70 = (Entry *)local_6e8._8_8_;
      local_68 = pEVar19;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::hash_for<slang::ast::OpaqueInstancePath::Entry>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                             *)in_stack_ffffffffffffeab0,(Entry *)in_stack_ffffffffffffeaa8);
      pEVar5 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                 *)in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
      local_10 = pEVar5;
      local_20 = local_78;
      local_8 = pEVar19;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                             *)0x7b93fb);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_ffffffffffffeab8,(size_t)in_stack_ffffffffffffeab0);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                 *)0x7b9459);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_ffffffffffffeb58 =
                 (SourceLocation)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                         *)0x7b94ac);
            in_stack_ffffffffffffeb60 = local_10;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
            ::
            key_from<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>
                      ((pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                        *)0x7b94df);
            bVar6 = std::equal_to<slang::ast::OpaqueInstancePath::Entry>::operator()
                              ((equal_to<slang::ast::OpaqueInstancePath::Entry> *)
                               in_stack_ffffffffffffeab0,(Entry *)in_stack_ffffffffffffeaa8,
                               (Entry *)0x7b9506);
            if (bVar6) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_007b95fb;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        in_stack_ffffffffffffeb57 =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_ffffffffffffeab0,(size_t)in_stack_ffffffffffffeaa8);
        if ((bool)in_stack_ffffffffffffeb57) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
          ::table_locator(&local_b0);
          goto LAB_007b95fb;
        }
        bVar6 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(in_RDI + 0x9b0));
      } while (bVar6);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>
      ::table_locator(&local_b0);
LAB_007b95fb:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 ::make_iterator((locator *)0x7b960a);
      local_6e8._24_8_ = local_88.pc_;
      local_6e8._32_8_ = local_88.p_;
      local_f58 = local_88.pc_;
      local_f50 = local_88.p_;
      local_f70 = boost::unordered::
                  unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                  ::end((unordered_flat_map<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                         *)0x7b96ae);
      bVar6 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_ffffffffffffeab0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_ffffffffffffeaa8);
      if (bVar6) {
        ppVar23 = boost::unordered::detail::foa::
                  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)in_stack_ffffffffffffeab0);
        local_f48 = (DefinitionSymbol *)&ppVar23->second;
      }
      comp = (Compilation *)local_f30->configRoot;
      locationOverride = (SourceLocation)local_f30->configRule;
      pDVar29 = local_f40;
      definition = local_f48;
      SourceLocation::SourceLocation(&local_f80);
      in_stack_ffffffffffffeb00 =
           (ConfigBlockSymbol *)
           InstanceSymbol::createDefault
                     (comp,definition,(HierarchyOverrideNode *)pDVar29,in_stack_ffffffffffffeb00,
                      (ConfigRule *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
                      locationOverride);
      local_f78 = in_stack_ffffffffffffeb00;
      std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
      operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *
                 )0x7b97be);
      Scope::addMember((Scope *)in_stack_ffffffffffffeab0,(Symbol *)in_stack_ffffffffffffeaa8);
      local_f88 = local_f78;
      SmallVectorBase<const_slang::ast::InstanceSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::InstanceSymbol_*> *)in_stack_ffffffffffffeab0,
                 (InstanceSymbol **)in_stack_ffffffffffffeaa8);
    }
    local_f8c = (underlying_type)
                ast::operator|((CompilationFlags)in_stack_ffffffffffffeab0,
                               (CompilationFlags)((ulong)in_stack_ffffffffffffeaa8 >> 0x20));
    bVar6 = hasFlag(in_stack_ffffffffffffeaa8,
                    (bitmask<slang::ast::CompilationFlags>)
                    (underlying_type)((ulong)in_stack_ffffffffffffeab0 >> 0x20));
    if (!bVar6) {
      bVar6 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              ::empty(&local_900);
      if (bVar6) {
        std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
        operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    *)0x7b9877);
        local_f90 = 0x2a000d;
        local_f98 = 0xffffffffffffffff;
        Scope::addDiag((Scope *)CONCAT17(in_stack_ffffffffffffeb57,in_stack_ffffffffffffeb50),code,
                       in_stack_ffffffffffffeb58);
      }
    }
    local_fa0 = in_RDI + 0x8d0;
    local_fa8._M_current =
         (DefinitionSymbol **)
         std::
         vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ::begin((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  *)in_stack_ffffffffffffeaa8);
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::end((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
           *)in_stack_ffffffffffffeaa8);
    while( true ) {
      bVar6 = __gnu_cxx::
              operator==<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                        ((__normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                          *)in_stack_ffffffffffffeab0,
                         (__normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
                          *)in_stack_ffffffffffffeaa8);
      if (((bVar6 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
      ::operator*(&local_fa8);
      std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
      operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *
                 )0x7b993c);
      InstanceSymbol::createInvalid
                (in_stack_ffffffffffffeae0,
                 (DefinitionSymbol *)CONCAT17(in_stack_ffffffffffffeadf,in_stack_ffffffffffffead8));
      Scope::addMember((Scope *)in_stack_ffffffffffffeab0,(Symbol *)in_stack_ffffffffffffeaa8);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
      ::operator++(&local_fa8);
    }
    SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy(local_ee8,in_RDI,src);
    std::span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::InstanceSymbol_*,_18446744073709551615UL>
              ((span<const_slang::ast::InstanceSymbol_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffeac0,
               (span<const_slang::ast::InstanceSymbol_*,_18446744073709551615UL> *)
               in_stack_ffffffffffffeab8);
    pRVar26 = std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ::operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                            *)0x7b99ef);
    (pRVar26->topInstances)._M_ptr = local_fc8;
    (pRVar26->topInstances)._M_extent._M_extent_value = sStack_fc0;
    std::span<const_slang::ast::CompilationUnitSymbol_*const,_18446744073709551615UL>::
    span<std::vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>_&>
              ((span<const_slang::ast::CompilationUnitSymbol_*const,_18446744073709551615UL> *)
               in_stack_ffffffffffffeac0,
               (vector<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
                *)in_stack_ffffffffffffeab8);
    pRVar26 = std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ::operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                            *)0x7b9a21);
    (pRVar26->compilationUnits)._M_ptr = local_fe8;
    (pRVar26->compilationUnits)._M_extent._M_extent_value = sStack_fe0;
    in_RDI[0x4d9] = (EVP_PKEY_CTX)0x0;
    in_RDI[0x4d8] = (EVP_PKEY_CTX)0x1;
    local_7e8._32_8_ =
         std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
         operator*((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    *)in_stack_ffffffffffffeab0);
    SmallVector<const_slang::ast::InstanceSymbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> *)0x7b9a74);
    SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
    ::~SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
                    *)0x7b9a81);
    ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/Compilation.cpp:330:29)>
    ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_Compilation_cpp:330:29)>
                   *)in_stack_ffffffffffffeab0);
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
    ::~unordered_flat_map
              ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>
                *)0x7b9a9b);
  }
  else {
    local_7e8._32_8_ =
         std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
         operator*((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    *)in_stack_ffffffffffffeab0);
  }
  return (RootSymbol *)local_7e8._32_8_;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamsAndBinds) {
    if (finalized)
        return *root;

    SLANG_ASSERT(!isFrozen());

    // Resolve default lib list now that we have all syntax trees added.
    defaultLiblist.reserve(options.defaultLiblist.size());
    for (auto& libName : options.defaultLiblist) {
        if (auto lib = getSourceLibrary(libName))
            defaultLiblist.push_back(lib);
    }

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<std::string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    if (!skipDefParamsAndBinds) {
        for (auto& tree : syntaxTrees) {
            auto& meta = tree->getMetadata();
            if (meta.hasDefparams || meta.hasBindDirectives) {
                resolveDefParamsAndBinds();
                break;
            }
        }
    }

    SLANG_ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() &&
                (param.isTypeParam || cliOverrides.find(param.name) == cliOverrides.end())) {
                return false;
            }
        }
        return true;
    };

    // Find top level modules (and programs) that form the root of the design.
    // Iterate the definitions map before instantiating any top level modules,
    // since that can cause changes to the definition map itself.
    SmallVector<std::pair<DefinitionLookupResult, SourceRange>> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                // Ignore definitions that are not top level. Top level definitions are:
                // - Modules and programs
                // - Not nested
                // - Have no non-defaulted parameters
                // - Not instantiated anywhere
                // - Not in a library
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (!def.sourceLibrary.isDefault ||
                    globalInstantiations.find(def.name) != globalInstantiations.end()) {
                    continue;
                }

                // Library definitions are never automatically instantiated in any capacity.
                if (!def.syntaxTree || !def.syntaxTree->isLibraryUnit) {
                    if (def.definitionKind == DefinitionKind::Module ||
                        def.definitionKind == DefinitionKind::Program) {
                        if (isValidTop(def)) {
                            // This definition can be automatically instantiated.
                            topDefs.push_back({{&def}, {}});
                            continue;
                        }
                    }
                }

                // Otherwise this definition is unreferenced and not automatically instantiated.
                unreferencedDefs.push_back(&def);
            }
        }
    }
    else {
        SmallMap<std::string_view, size_t, 4> topNameMap;
        auto tryAddTop = [&](DefinitionLookupResult result, SourceRange sourceRange) {
            // Make sure this definition's name doesn't collide with a top
            // module we already previously selected.
            auto def = result.definition;
            auto [it, inserted] = topNameMap.emplace(def->name, topDefs.size());
            if (inserted) {
                topDefs.push_back({result, sourceRange});
                SLANG_ASSERT(def->kind == SymbolKind::Definition);
                def->as<DefinitionSymbol>().noteInstantiated();
            }
            else {
                auto& diag = root->addDiag(diag::MultipleTopDupName, sourceRange.start()
                                                                         ? sourceRange
                                                                         : SourceRange::NoLocation);
                diag << def->name;

                auto& entry = topDefs[it->second];
                if (entry.first.configRoot)
                    diag.addNote(diag::NoteConfigRule, entry.second);
            }
        };

        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        for (auto userProvidedName : options.topModules) {
            // Find the target library, if there is one specified.
            auto searchName = userProvidedName;
            const SourceLibrary* targetLib = nullptr;
            if (auto idx = searchName.find('.'); idx != std::string_view::npos) {
                targetLib = getSourceLibrary(searchName.substr(0, idx));
                if (!targetLib) {
                    root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << userProvidedName;
                    continue;
                }

                searchName = searchName.substr(idx + 1);
            }

            // A trailing ':config' is stripped -- it's there to allow the user
            // to disambiguate modules and config blocks.
            bool onlyConfig = false;
            constexpr std::string_view configSuffix = ":config";
            if (searchName.ends_with(configSuffix)) {
                onlyConfig = true;
                searchName = searchName.substr(0, searchName.length() - configSuffix.length());
            }

            if (!onlyConfig) {
                if (auto defIt = definitionMap.find(std::tuple{searchName, root.get()});
                    defIt != definitionMap.end()) {

                    const DefinitionSymbol* foundDef = nullptr;
                    for (auto defSym : defIt->second.first) {
                        if (defSym->kind != SymbolKind::Definition)
                            continue;

                        auto& def = defSym->as<DefinitionSymbol>();
                        if (&def.sourceLibrary == targetLib ||
                            (!targetLib && def.sourceLibrary.isDefault)) {
                            foundDef = &def;
                            break;
                        }
                    }

                    if (foundDef) {
                        if ((foundDef->definitionKind == DefinitionKind::Module ||
                             foundDef->definitionKind == DefinitionKind::Program) &&
                            isValidTop(*foundDef)) {

                            tryAddTop({foundDef}, {});
                        }
                        else {
                            // Otherwise, issue an error because the user asked us to instantiate
                            // this.
                            foundDef->getParentScope()->addDiag(diag::InvalidTopModule,
                                                                SourceLocation::NoLocation)
                                << userProvidedName;
                        }
                        continue;
                    }
                }
            }

            if (auto confIt = configBlocks.find(searchName); confIt != configBlocks.end()) {
                const ConfigBlockSymbol* foundConf = nullptr;
                for (auto conf : confIt->second) {
                    auto lib = conf->getSourceLibrary();
                    SLANG_ASSERT(lib);

                    if (lib == targetLib || (!targetLib && lib->isDefault)) {
                        foundConf = conf;
                        break;
                    }
                }

                if (foundConf) {
                    foundConf->isUsed = true;
                    for (auto& cell : foundConf->getTopCells())
                        tryAddTop({&cell.definition, foundConf, cell.rule}, cell.sourceRange);
                    continue;
                }
            }

            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << userProvidedName;
        }

        // Go back through the definition map and find all definitions that are unused,
        // unreferenced in the design, and candidates for instantiating in unreferenced
        // form to get some error checking of their contents.
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (globalInstantiations.find(def.name) == globalInstantiations.end() &&
                    def.sourceLibrary.isDefault && def.getInstanceCount() == 0) {
                    unreferencedDefs.push_back(&def);
                }
            }
        }
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    std::ranges::sort(topDefs, [](auto a, auto b) {
        return a.first.definition->name < b.first.definition->name;
    });
    std::ranges::sort(unreferencedDefs, [](auto a, auto b) { return a->name < b->name; });

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    // TODO: generalize these to full hierarchical paths
    if (!cliOverrides.empty()) {
        for (auto [result, _] : topDefs) {
            auto& def = result.definition->as<DefinitionSymbol>();
            for (auto& param : def.parameters) {
                if (!param.isTypeParam && param.hasSyntax) {
                    auto it = cliOverrides.find(param.name);
                    if (it != cliOverrides.end()) {
                        hierarchyOverrides.childNodes[*def.getSyntax()].paramOverrides.emplace(
                            param.valueDecl, std::pair{*it->second, nullptr});
                    }
                }
            }
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto [result, _] : topDefs) {
        auto& def = result.definition->as<DefinitionSymbol>();
        HierarchyOverrideNode* hierarchyOverrideNode = nullptr;
        if (auto sit = hierarchyOverrides.childNodes.find(*def.getSyntax());
            sit != hierarchyOverrides.childNodes.end()) {
            hierarchyOverrideNode = &sit->second;
        }

        auto& instance = InstanceSymbol::createDefault(*this, def, hierarchyOverrideNode,
                                                       result.configRoot, result.configRule);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!hasFlag(CompilationFlags::LintMode | CompilationFlags::AllowTopLevelIfacePorts) &&
        topDefs.empty()) {
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);
    }

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    return *root;
}